

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O3

void __thiscall sznet::net::KcpConnection::handleKcpClose(KcpConnection *this)

{
  StateE SVar1;
  EventLoop *this_00;
  bool bVar2;
  LogStream *this_01;
  char **ppcVar3;
  char *pcVar4;
  SourceFile file;
  undefined1 local_ff0 [8];
  KcpConnectionPtr guardThis;
  char *local_40 [4];
  StateE local_1c;
  
  this_00 = this->m_loop;
  bVar2 = EventLoop::isInLoopThread(this_00);
  if (!bVar2) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  if (g_logLevel < 1) {
    file._8_8_ = 0x11;
    file.m_data = "KcpConnection.cpp";
    Logger::Logger((Logger *)local_ff0,file,0x193,TRACE,"handleKcpClose");
    if (5 < (uint)((int)local_40 - (int)local_40[0])) {
      builtin_strncpy(local_40[0],"fd = ",5);
      local_40[0] = local_40[0] + 5;
    }
    this_01 = LogStream::operator<<((LogStream *)&guardThis,(this->m_udpSocket).m_sockfd);
    pcVar4 = (this_01->m_buffer).m_cur;
    ppcVar3 = &(this_01->m_buffer).m_cur;
    if (9 < (uint)((int)ppcVar3 - (int)pcVar4)) {
      builtin_strncpy(pcVar4," state = ",9);
      *ppcVar3 = *ppcVar3 + 9;
    }
    if ((ulong)this->m_state < 5) {
      pcVar4 = *(char **)(&DAT_001484e0 + (ulong)this->m_state * 8);
    }
    else {
      pcVar4 = "unknown state";
    }
    LogStream::operator<<(this_01,pcVar4);
    Logger::~Logger((Logger *)local_ff0);
  }
  SVar1 = this->m_state;
  if (SVar1 - kDisconnecting < 3) {
    this->m_state = kDisconnected;
    EventLoop::cancel(this->m_loop,this->m_kcpUpdateTimerId);
    EventLoop::cancel(this->m_loop,this->m_verifyTimerId);
    std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::KcpConnection,void>
              ((__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_ff0,
               (__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    if ((this->m_kcpConnectionCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_kcpConnectionCallback)._M_invoker)
                ((_Any_data *)&this->m_kcpConnectionCallback,
                 (shared_ptr<sznet::net::KcpConnection> *)local_ff0);
      local_1c = SVar1;
      if ((this->m_kcpCloseCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->m_kcpCloseCallback)._M_invoker)
                  ((_Any_data *)&this->m_kcpCloseCallback,
                   (shared_ptr<sznet::net::KcpConnection> *)local_ff0,(int *)&local_1c);
        if (guardThis.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     guardThis.
                     super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        return;
      }
    }
    std::__throw_bad_function_call();
  }
  __assert_fail("m_state == kConnected || m_state == kConnecting || m_state == kDisconnecting",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                ,0x195,"void sznet::net::KcpConnection::handleKcpClose()");
}

Assistant:

void KcpConnection::handleKcpClose()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "fd = " << m_udpSocket.fd() << " state = " << stateToString();
	int oldState = implicit_cast<int>(m_state);
	assert(m_state == kConnected || m_state == kConnecting || m_state == kDisconnecting);
	// we don't close fd, leave it to dtor, so we can find leaks easily.
	setState(kDisconnected);
	
	// ���ͷ���
	m_loop->cancel(m_kcpUpdateTimerId);
	m_loop->cancel(m_verifyTimerId);

	// ��ֹ��ǰ�ͷţ����ɲ���Ԥ��������
	KcpConnectionPtr guardThis(shared_from_this());
	m_kcpConnectionCallback(guardThis);
	// must be the last line
	m_kcpCloseCallback(guardThis, oldState);
}